

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O2

P __thiscall ccs::ast::SelectorBranch::descendant(SelectorBranch *this,P *first)

{
  pointer p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  P PVar2;
  __allocator_type __a2;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<ccs::ast::BranchImpl,_std::allocator<ccs::ast::BranchImpl>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_78;
  __shared_ptr<ccs::ast::SelectorLeaf,_(__gnu_cxx::_Lock_policy)2> local_68;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  undefined8 local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  p_Var1 = std::
           allocator_traits<std::allocator<std::_Sp_counted_ptr_inplace<ccs::ast::BranchImpl,_std::allocator<ccs::ast::BranchImpl>,_(__gnu_cxx::_Lock_policy)2>_>_>
           ::allocate(&__a2,1);
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_00173330;
  local_78._M_alloc = &__a2;
  local_78._M_ptr = p_Var1;
  std::__shared_ptr<ccs::ast::SelectorLeaf,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_68,
             &first->super___shared_ptr<ccs::ast::SelectorLeaf,_(__gnu_cxx::_Lock_policy)2>);
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_40 = std::
             _Function_handler<std::shared_ptr<ccs::BuildContext>_(ccs::ast::SelectorLeaf_&,_std::shared_ptr<ccs::BuildContext>,_std::shared_ptr<ccs::BuildContext>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/src/parser/ast.cpp:138:46)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<std::shared_ptr<ccs::BuildContext>_(ccs::ast::SelectorLeaf_&,_std::shared_ptr<ccs::BuildContext>,_std::shared_ptr<ccs::BuildContext>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/src/parser/ast.cpp:138:46)>
             ::_M_manager;
  BranchImpl::BranchImpl((BranchImpl *)&p_Var1->_M_impl,(P *)&local_68,(Traverse *)&local_58);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
  local_78._M_ptr = (pointer)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<ccs::ast::BranchImpl,_std::allocator<ccs::ast::BranchImpl>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr(&local_78);
  this->_vptr_SelectorBranch = (_func_int **)&p_Var1->_M_impl;
  local_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this[1]._vptr_SelectorBranch = (_func_int **)p_Var1;
  local_38 = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  PVar2.super___shared_ptr<ccs::ast::SelectorBranch,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar2.super___shared_ptr<ccs::ast::SelectorBranch,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (P)PVar2.super___shared_ptr<ccs::ast::SelectorBranch,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SelectorBranch::P SelectorBranch::descendant(SelectorLeaf::P first) {
  return std::make_shared<BranchImpl>(first, [](SelectorLeaf &first,
              BuildContext::P context, BuildContext::P baseContext) {
    (void)baseContext;
    return context->descendant(context->traverse(first));
  });
}